

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O1

uchar * rlReadScreenPixels(int width,int height)

{
  uint uVar1;
  void *__ptr;
  uchar *puVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  size_t __nmemb;
  bool bVar8;
  
  __nmemb = (size_t)(width * height * 4);
  __ptr = calloc(__nmemb,1);
  iVar6 = 0;
  (*glad_glReadPixels)(0,0,width,height,0x1908,0x1401,__ptr);
  puVar2 = (uchar *)malloc(__nmemb);
  if (0 < height) {
    uVar1 = width * 4;
    uVar3 = 1;
    if (1 < (int)uVar1) {
      uVar3 = (ulong)uVar1;
    }
    iVar5 = (height + -1) * width * 4;
    uVar4 = (ulong)(uint)height;
    do {
      if (0 < width) {
        uVar7 = 1;
        do {
          puVar2[uVar7 + (long)iVar6 + -1] =
               -((uVar7 & 3) == 0) | *(byte *)((long)__ptr + uVar7 + (long)iVar5 + -1);
          bVar8 = uVar7 != uVar3;
          uVar7 = uVar7 + 1;
        } while (bVar8);
      }
      iVar6 = iVar6 + uVar1;
      iVar5 = iVar5 + width * -4;
      bVar8 = 1 < (long)uVar4;
      uVar4 = uVar4 - 1;
    } while (bVar8);
  }
  free(__ptr);
  return puVar2;
}

Assistant:

unsigned char *rlReadScreenPixels(int width, int height)
{
    unsigned char *screenData = (unsigned char *)RL_CALLOC(width*height*4, sizeof(unsigned char));

    // NOTE 1: glReadPixels returns image flipped vertically -> (0,0) is the bottom left corner of the framebuffer
    // NOTE 2: We are getting alpha channel! Be careful, it can be transparent if not cleared properly!
    glReadPixels(0, 0, width, height, GL_RGBA, GL_UNSIGNED_BYTE, screenData);

    // Flip image vertically!
    unsigned char *imgData = (unsigned char *)RL_MALLOC(width*height*4*sizeof(unsigned char));

    for (int y = height - 1; y >= 0; y--)
    {
        for (int x = 0; x < (width*4); x++)
        {
            imgData[((height - 1) - y)*width*4 + x] = screenData[(y*width*4) + x];  // Flip line

            // Set alpha component value to 255 (no trasparent image retrieval)
            // NOTE: Alpha value has already been applied to RGB in framebuffer, we don't need it!
            if (((x + 1)%4) == 0) imgData[((height - 1) - y)*width*4 + x] = 255;
        }
    }

    RL_FREE(screenData);

    return imgData;     // NOTE: image data should be freed
}